

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

int mbedtls_mpi_read_string(mbedtls_mpi *X,int radix,char *s)

{
  ulong *puVar1;
  char cVar2;
  mbedtls_mpi_uint *pmVar3;
  mbedtls_mpi *X_00;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  mbedtls_mpi _B;
  mbedtls_mpi T;
  ulong local_80;
  mbedtls_mpi local_78;
  char *local_60;
  size_t local_58;
  mbedtls_mpi *local_50;
  mbedtls_mpi local_48;
  
  iVar4 = -4;
  if (0xfffffff0 < radix - 0x11U) {
    local_48.s = 1;
    local_48.n = 0;
    local_48.p = (mbedtls_mpi_uint *)0x0;
    sVar5 = strlen(s);
    if (radix == 0x10) {
      if (((sVar5 >> 0x3e == 0) &&
          (iVar4 = mbedtls_mpi_grow(X,((sVar5 >> 4) + 1) - (ulong)((sVar5 & 0xf) == 0)), iVar4 == 0)
          ) && (iVar4 = mbedtls_mpi_grow(X,1), iVar4 == 0)) {
        memset(X->p,0,X->n << 3);
        pmVar3 = X->p;
        *pmVar3 = 0;
        X->s = 1;
        bVar8 = 0;
        uVar9 = 0;
        while( true ) {
          if (sVar5 == 1) {
            if (*s == '-') {
              X->s = -1;
              return 0;
            }
          }
          else if (sVar5 == 0) {
            return 0;
          }
          cVar2 = s[sVar5 - 1];
          iVar4 = (int)cVar2;
          uVar10 = (ulong)(iVar4 - 0x30);
          if (9 < (byte)(cVar2 - 0x30U)) {
            uVar10 = 0xff;
          }
          uVar11 = (ulong)(iVar4 - 0x37);
          if (5 < (byte)(cVar2 + 0xbfU)) {
            uVar11 = uVar10;
          }
          uVar10 = (ulong)(iVar4 - 0x57);
          if (5 < (byte)(cVar2 + 0x9fU)) {
            uVar10 = uVar11;
          }
          if (0xf < uVar10) break;
          puVar1 = pmVar3 + (uVar9 >> 4);
          *puVar1 = *puVar1 | uVar10 << (bVar8 & 0x3c);
          sVar5 = sVar5 - 1;
          uVar9 = uVar9 + 1;
          bVar8 = bVar8 + 4;
        }
        iVar4 = -6;
      }
    }
    else {
      iVar4 = mbedtls_mpi_grow(X,1);
      if (iVar4 == 0) {
        iVar4 = 0;
        memset(X->p,0,X->n << 3);
        *X->p = 0;
        X->s = 1;
        if (sVar5 != 0) {
          sVar7 = 0;
          local_60 = s;
          local_58 = sVar5;
          local_50 = X;
          do {
            X_00 = local_50;
            if ((sVar7 == 0) && (*s == '-')) {
              local_50->s = -1;
            }
            else {
              cVar2 = s[sVar7];
              iVar4 = (int)cVar2;
              uVar9 = (ulong)(iVar4 - 0x30);
              if (9 < (byte)(cVar2 - 0x30U)) {
                uVar9 = 0xff;
              }
              uVar10 = (ulong)(iVar4 - 0x37);
              if (5 < (byte)(cVar2 + 0xbfU)) {
                uVar10 = uVar9;
              }
              uVar9 = (ulong)(iVar4 - 0x57);
              if (5 < (byte)(cVar2 + 0x9fU)) {
                uVar9 = uVar10;
              }
              if ((uint)radix <= uVar9) {
                iVar4 = -6;
                goto LAB_00104d4d;
              }
              local_78.s = 1;
              local_78.n = 1;
              local_78.p = &local_80;
              local_80 = (ulong)(uint)radix;
              iVar4 = mbedtls_mpi_mul_mpi(&local_48,local_50,&local_78);
              if (iVar4 != 0) goto LAB_00104d4d;
              local_80 = uVar9;
              if (X_00->s == 1) {
                local_78.s = 1;
                local_78.n = 1;
                local_78.p = &local_80;
                iVar4 = mbedtls_mpi_add_mpi(X_00,&local_48,&local_78);
              }
              else {
                local_78.s = 1;
                local_78.n = 1;
                local_78.p = &local_80;
                iVar4 = mbedtls_mpi_sub_mpi(X_00,&local_48,&local_78);
              }
              s = local_60;
              sVar5 = local_58;
              if (iVar4 != 0) goto LAB_00104d4d;
            }
            sVar7 = sVar7 + 1;
          } while (sVar5 != sVar7);
          iVar4 = 0;
LAB_00104d4d:
          if (local_48.p != (mbedtls_mpi_uint *)0x0) {
            if (local_48.n != 0) {
              sVar6 = 0;
              do {
                local_48.p[sVar6] = 0;
                sVar6 = sVar6 + 1;
              } while (local_48.n != sVar6);
            }
            free(local_48.p);
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int mbedtls_mpi_read_string( mbedtls_mpi *X, int radix, const char *s )
{
    int ret;
    size_t i, j, slen, n;
    mbedtls_mpi_uint d;
    mbedtls_mpi T;

    if( radix < 2 || radix > 16 )
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

    mbedtls_mpi_init( &T );

    slen = strlen( s );

    if( radix == 16 )
    {
        if( slen > MPI_SIZE_T_MAX >> 2 )
            return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

        n = BITS_TO_LIMBS( slen << 2 );

        MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, n ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_lset( X, 0 ) );

        for( i = slen, j = 0; i > 0; i--, j++ )
        {
            if( i == 1 && s[i - 1] == '-' )
            {
                X->s = -1;
                break;
            }

            MBEDTLS_MPI_CHK( mpi_get_digit( &d, radix, s[i - 1] ) );
            X->p[j / ( 2 * ciL )] |= d << ( ( j % ( 2 * ciL ) ) << 2 );
        }
    }
    else
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_lset( X, 0 ) );

        for( i = 0; i < slen; i++ )
        {
            if( i == 0 && s[i] == '-' )
            {
                X->s = -1;
                continue;
            }

            MBEDTLS_MPI_CHK( mpi_get_digit( &d, radix, s[i] ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_int( &T, X, radix ) );

            if( X->s == 1 )
            {
                MBEDTLS_MPI_CHK( mbedtls_mpi_add_int( X, &T, d ) );
            }
            else
            {
                MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( X, &T, d ) );
            }
        }
    }

cleanup:

    mbedtls_mpi_free( &T );

    return( ret );
}